

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void __thiscall PhPacker_Arg_v_Test::~PhPacker_Arg_v_Test(PhPacker_Arg_v_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PhPacker, Arg_v)
{
    uint16_t val = 123;
    auto s = PhPacker::pack<uint16_t>('v', val);
    uint16_t res = std::any_cast<uint16_t>(PhPacker::unpack('v', s));
    EXPECT_EQ(res, 123);

    std::string str = PhPacker::pack<uint16_t>('v', std::numeric_limits<uint16_t>::max());
    uint16_t result = std::any_cast<uint16_t>(PhPacker::unpack('v', str));
    uint16_t expected = std::numeric_limits<uint16_t>::max();
    GTEST_ASSERT_EQ(result, expected);

    str = PhPacker::pack<uint16_t>('v', std::numeric_limits<uint16_t>::min());
    result = std::any_cast<uint16_t>(PhPacker::unpack('v', str));
    expected = std::numeric_limits<uint16_t>::min();
    GTEST_ASSERT_EQ(result, expected);
}